

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.hpp
# Opt level: O0

OptionMap * DefaultOptions(void)

{
  initializer_list<std::pair<const_Option,_int>_> __l;
  OptionMap *in_RDI;
  pair<const_Option,_int> local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  allocator_type *__a;
  less<Option> *__comp;
  map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
  *in_stack_ffffffffffffffe0;
  iterator ppVar1;
  size_type sVar2;
  
  local_38 = 2;
  __a = (allocator_type *)0x3;
  local_48.first = ExternalVRR;
  local_48.second = 0;
  uStack_40 = 1;
  __comp = (less<Option> *)0x4;
  ppVar1 = &local_48;
  sVar2 = 5;
  std::allocator<std::pair<const_Option,_int>_>::allocator
            ((allocator<std::pair<const_Option,_int>_> *)0x10b1c8);
  __l._M_len = sVar2;
  __l._M_array = ppVar1;
  std::map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>::map
            (in_stack_ffffffffffffffe0,__l,__comp,__a);
  std::allocator<std::pair<const_Option,_int>_>::~allocator
            ((allocator<std::pair<const_Option,_int>_> *)0x10b1f2);
  return in_RDI;
}

Assistant:

inline OptionMap DefaultOptions(void)
{
    return OptionMap{
                      {Option::ExternalVRR, 0},
                      {Option::GeneralVRR, 0},
                      {Option::ExternalHRR, 0},
                      {Option::GeneralHRR, 0},
                      {Option::FinalPermute, 0},
                    };
}